

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

auto_ptr<cmFileListGeneratorBase> __thiscall
cmFileListGeneratorCaseInsensitive::Clone(cmFileListGeneratorCaseInsensitive *this)

{
  cmFileListGeneratorCaseInsensitive *this_00;
  cmFileListGeneratorCaseInsensitive *in_RSI;
  
  this_00 = (cmFileListGeneratorCaseInsensitive *)operator_new(0x30);
  cmFileListGeneratorCaseInsensitive(this_00,in_RSI);
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase = (_func_int **)this_00;
  return (auto_ptr<cmFileListGeneratorBase>)&this->super_cmFileListGeneratorBase;
}

Assistant:

virtual cmsys::auto_ptr<cmFileListGeneratorBase> Clone() const
    {
    cmsys::auto_ptr<cmFileListGeneratorBase>
      g(new cmFileListGeneratorCaseInsensitive(*this));
    return g;
    }